

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMRangeImpl::updateRangeForDeletedText
          (DOMRangeImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count)

{
  short sVar1;
  int iVar2;
  short type;
  XMLSize_t count_local;
  XMLSize_t offset_local;
  DOMNode *node_local;
  DOMRangeImpl *this_local;
  
  if (node != (DOMNode *)0x0) {
    iVar2 = (*this->fStartContainer->_vptr_DOMNode[4])();
    sVar1 = (short)iVar2;
    if ((node == this->fStartContainer) &&
       ((((sVar1 == 3 || (sVar1 == 4)) || (sVar1 == 8)) || (sVar1 == 7)))) {
      if (offset + count < this->fStartOffset) {
        this->fStartOffset = this->fStartOffset - count;
      }
      else if (offset < this->fStartOffset) {
        this->fStartOffset = offset;
      }
    }
    iVar2 = (*this->fEndContainer->_vptr_DOMNode[4])();
    sVar1 = (short)iVar2;
    if ((node == this->fEndContainer) &&
       (((sVar1 == 3 || (sVar1 == 4)) || ((sVar1 == 8 || (sVar1 == 7)))))) {
      if (offset + count < this->fEndOffset) {
        this->fEndOffset = this->fEndOffset - count;
      }
      else if (offset < this->fEndOffset) {
        this->fEndOffset = offset;
      }
    }
  }
  return;
}

Assistant:

void DOMRangeImpl::updateRangeForDeletedText(DOMNode* node, XMLSize_t offset, XMLSize_t count)
{
    if (node == 0) return;

    short type = fStartContainer->getNodeType();
    if (node == fStartContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        if (fStartOffset > offset+count) {
            fStartOffset = fStartOffset-count;
        } else if (fStartOffset > offset) {
            fStartOffset = offset;
        }
    }
    type = fEndContainer->getNodeType();
    if (node == fEndContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        if (fEndOffset > offset+count) {
            fEndOffset = fEndOffset-count;
        } else if (fEndOffset > offset) {
            fEndOffset = offset;
        }
    }
}